

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask27_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  
  auVar4 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_001a1160);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(in + 7);
  auVar5 = vpsrlvd_avx2(auVar11,_DAT_001a1180);
  auVar8 = vpbroadcastd_avx512vl();
  uVar1 = in[9];
  auVar8 = vpblendd_avx2(ZEXT1632(*(undefined1 (*) [16])(in + 1)),auVar8,0x10);
  auVar11 = vpshufd_avx(auVar11,0x50);
  auVar3 = vpmovsxbd_avx(ZEXT416(0x100120d));
  auVar10._0_16_ = ZEXT116(0) * auVar11 + ZEXT116(1) * auVar8._0_16_;
  auVar10._16_16_ = ZEXT116(0) * auVar8._16_16_ + ZEXT116(1) * auVar11;
  auVar9 = valignd_avx512vl(ZEXT1632(auVar4),ZEXT1632(auVar4),7);
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x60);
  auVar10 = vpbroadcastd_avx512vl();
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x80);
  auVar10 = vpsllvd_avx2(auVar8,_DAT_001ae5a0);
  auVar8 = vpblendd_avx2(auVar9,ZEXT432(*in),1);
  auVar9 = vpbroadcastd_avx512vl();
  uVar2 = in[0xc];
  auVar8 = vpblendd_avx2(auVar8,auVar9,0x20);
  uVar12 = auVar5._0_8_;
  auVar9._8_8_ = uVar12;
  auVar9._0_8_ = uVar12;
  auVar9._16_8_ = uVar12;
  auVar9._24_8_ = uVar12;
  auVar8 = vpblendd_avx2(auVar8,auVar9,0xc0);
  auVar8 = vpor_avx2(auVar10,auVar8);
  *(undefined1 (*) [32])out = auVar8;
  vpmovsxbd_avx(ZEXT416(0x38342c28));
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  auVar11 = vpshufd_avx(auVar7,0xa0);
  auVar11 = vpinsrd_avx(auVar11,uVar1,0);
  auVar4 = vpinsrd_avx(auVar11,uVar2 << 4,2);
  auVar5 = vpinsrd_avx(auVar3,auVar7._4_4_ >> 0x17,2);
  auVar6 = vpsrlvd_avx2(auVar11,auVar3);
  auVar3 = vpsllvd_avx2(auVar7,_DAT_001ad740);
  uVar1 = in[0xf];
  auVar11 = vpor_avx(auVar4,auVar5);
  auVar11 = vpblendd_avx2(auVar6,auVar11,4);
  auVar11 = vpor_avx(auVar3,auVar11);
  *(undefined1 (*) [16])(out + 8) = auVar11;
  out[0xc] = uVar1 << 0x15 | auVar7._12_4_ >> 6;
  out[0xd] = uVar1 >> 0xb;
  return out + 0xe;
}

Assistant:

uint32_t *__fastpackwithoutmask27_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (27 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (27 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (27 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (27 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (27 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (27 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (27 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (27 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (27 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  *out = ((*in)) >> (27 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (27 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (27 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (27 - 16);
  ++in;

  return out + 1;
}